

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O2

uint64_t __thiscall DatabaseConfig::get(DatabaseConfig *this,ConfigKey *key)

{
  bool bVar1;
  reference this_00;
  uint64_t uVar2;
  const_iterator local_60;
  const_iterator local_40;
  
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<std::__cxx11::string_const&>
            (&local_60,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)this,&key->key_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend(&local_40,&this->config_);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(&local_60,&local_40);
  if (bVar1) {
    this_00 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_60);
    uVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<unsigned_long,_unsigned_long,_0>(this_00);
  }
  else {
    uVar2 = key->defval_;
  }
  return uVar2;
}

Assistant:

uint64_t DatabaseConfig::get(const ConfigKey &key) const {
    if (const auto &it = config_.find(key.key()); it != config_.end()) {
        return *it;
    }
    return key.defval();
}